

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O0

bool __thiscall spvtools::opt::SSAPropagator::Run(SSAPropagator *this,Function *fn)

{
  Function *this_00;
  bool bVar1;
  reference ppBVar2;
  reference ppIVar3;
  byte local_61;
  anon_class_8_1_8991fb9c local_58;
  function<void_(spvtools::opt::Instruction_*)> local_50;
  Instruction *local_30;
  Instruction *instr;
  value_type block;
  Function *pFStack_18;
  bool changed;
  Function *fn_local;
  SSAPropagator *this_local;
  
  pFStack_18 = fn;
  fn_local = (Function *)this;
  Initialize(this,fn);
  block._7_1_ = 0;
  while( true ) {
    bVar1 = std::
            queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
            ::empty(&this->blocks_);
    local_61 = 1;
    if (bVar1) {
      bVar1 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::empty(&this->ssa_edge_uses_);
      local_61 = bVar1 ^ 0xff;
    }
    this_00 = pFStack_18;
    if ((local_61 & 1) == 0) break;
    bVar1 = std::
            queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
            ::empty(&this->blocks_);
    if (bVar1) {
      bVar1 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::empty(&this->ssa_edge_uses_);
      if (!bVar1) {
        ppIVar3 = std::
                  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::front(&this->ssa_edge_uses_);
        local_30 = *ppIVar3;
        bVar1 = Simulate(this,local_30);
        block._7_1_ = (block._7_1_ & 1) != 0 || bVar1;
        std::
        queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
        ::pop(&this->ssa_edge_uses_);
      }
    }
    else {
      ppBVar2 = std::
                queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                ::front(&this->blocks_);
      instr = (Instruction *)*ppBVar2;
      bVar1 = Simulate(this,(BasicBlock *)instr);
      block._7_1_ = (block._7_1_ & 1) != 0 || bVar1;
      std::
      queue<spvtools::opt::BasicBlock_*,_std::deque<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
      ::pop(&this->blocks_);
    }
  }
  local_58.this = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::SSAPropagator::Run(spvtools::opt::Function*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_50,&local_58);
  opt::Function::ForEachInst(this_00,&local_50,false,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_50);
  return (bool)(block._7_1_ & 1);
}

Assistant:

bool SSAPropagator::Run(Function* fn) {
  Initialize(fn);

  bool changed = false;
  while (!blocks_.empty() || !ssa_edge_uses_.empty()) {
    // Simulate all blocks first. Simulating blocks will add SSA edges to
    // follow after all the blocks have been simulated.
    if (!blocks_.empty()) {
      auto block = blocks_.front();
      changed |= Simulate(block);
      blocks_.pop();
      continue;
    }

    // Simulate edges from the SSA queue.
    if (!ssa_edge_uses_.empty()) {
      Instruction* instr = ssa_edge_uses_.front();
      changed |= Simulate(instr);
      ssa_edge_uses_.pop();
    }
  }

#ifndef NDEBUG
  // Verify all visited values have settled. No value that has been simulated
  // should end on not interesting.
  fn->ForEachInst([this](Instruction* inst) {
    assert(
        (!HasStatus(inst) || Status(inst) != SSAPropagator::kNotInteresting) &&
        "Unsettled value");
  });
#endif

  return changed;
}